

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall leveldb::Block::Iter::CorruptionError(Iter *this)

{
  char *pcVar1;
  long in_FS_OFFSET;
  Slice local_48;
  Slice local_38;
  Status local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->current_ = this->restarts_;
  this->restart_index_ = this->num_restarts_;
  local_38.data_ = "bad entry in block";
  local_38.size_ = 0x12;
  local_48.data_ = "";
  local_48.size_ = 0;
  Status::Status(&local_28,kCorruption,&local_38,&local_48);
  pcVar1 = (this->status_).state_;
  (this->status_).state_ = local_28.state_;
  local_28.state_ = pcVar1;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  (this->value_).data_ = "";
  (this->value_).size_ = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CorruptionError() {
    current_ = restarts_;
    restart_index_ = num_restarts_;
    status_ = Status::Corruption("bad entry in block");
    key_.clear();
    value_.clear();
  }